

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O2

void __thiscall
Kernel::InterpretedLiteralEvaluator::InterpretedLiteralEvaluator
          (InterpretedLiteralEvaluator *this,bool doNormalize)

{
  EvalStack *this_00;
  Evaluator *pEVar1;
  ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)25>_> *this_01;
  ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)27>_> *this_02;
  ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)40>_> *this_03;
  ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)42>_> *this_04;
  ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)55>_> *this_05;
  ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)57>_> *this_06;
  
  (this->super_BottomUpTermTransformer).super_TermTransformerCommon._vptr_TermTransformerCommon =
       (_func_int **)&PTR_transform_009fdcf8;
  this_00 = &this->_evals;
  (this->_evals)._capacity = 0;
  (this->_evals)._stack = (Evaluator **)0x0;
  (this->_evals)._cursor = (Evaluator **)0x0;
  (this->_evals)._end = (Evaluator **)0x0;
  (this->_funEvaluators)._size = 0;
  (this->_funEvaluators)._capacity = 0;
  (this->_funEvaluators)._array = (Evaluator **)0x0;
  (this->_predEvaluators)._size = 0;
  (this->_predEvaluators)._capacity = 0;
  (this->_predEvaluators)._array = (Evaluator **)0x0;
  this->_normalize = doNormalize;
  pEVar1 = (Evaluator *)::operator_new(8);
  pEVar1->_vptr_Evaluator = (_func_int **)&PTR__Evaluator_009fdd60;
  Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push(this_00,pEVar1);
  pEVar1 = (Evaluator *)::operator_new(8);
  pEVar1->_vptr_Evaluator = (_func_int **)&PTR__Evaluator_009fde10;
  Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push(this_00,pEVar1);
  pEVar1 = (Evaluator *)::operator_new(8);
  pEVar1->_vptr_Evaluator = (_func_int **)&PTR__Evaluator_009fdeb0;
  Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push(this_00,pEVar1);
  pEVar1 = (Evaluator *)::operator_new(8);
  pEVar1->_vptr_Evaluator = (_func_int **)&PTR__Evaluator_009fdf50;
  Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push(this_00,pEVar1);
  pEVar1 = (Evaluator *)::operator_new(8);
  pEVar1->_vptr_Evaluator = (_func_int **)&PTR__Evaluator_009fdfa8;
  Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push(this_00,pEVar1);
  if ((*(char *)(Lib::env + 0xaa6a) == '\x01') && (*(char *)(Lib::env + 0xe582) == '\0')) {
    this_01 = (ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)25>_> *)
              ::operator_new(0x10);
    ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)25>_>::ACFunEvaluator
              (this_01);
    Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push(this_00,(Evaluator *)this_01)
    ;
    this_02 = (ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)27>_> *)
              ::operator_new(0x10);
    ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)27>_>::ACFunEvaluator
              (this_02);
    Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push(this_00,(Evaluator *)this_02)
    ;
    this_03 = (ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)40>_> *)
              ::operator_new(0x10);
    ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)40>_>::ACFunEvaluator
              (this_03);
    Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push(this_00,(Evaluator *)this_03)
    ;
    this_04 = (ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)42>_> *)
              ::operator_new(0x10);
    ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)42>_>::ACFunEvaluator
              (this_04);
    Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push(this_00,(Evaluator *)this_04)
    ;
    this_05 = (ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)55>_> *)
              ::operator_new(0x10);
    ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)55>_>::ACFunEvaluator
              (this_05);
    Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push(this_00,(Evaluator *)this_05)
    ;
    this_06 = (ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)57>_> *)
              ::operator_new(0x10);
    ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)57>_>::ACFunEvaluator
              (this_06);
    Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::push(this_00,(Evaluator *)this_06)
    ;
  }
  Lib::DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::ensure(&this->_funEvaluators,0);
  Lib::DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::ensure(&this->_predEvaluators,0);
  return;
}

Assistant:

InterpretedLiteralEvaluator::InterpretedLiteralEvaluator(bool doNormalize) : _normalize(doNormalize)
{
  // For an evaluator to be used it must be pushed onto _evals
  // We search this list, calling canEvaluate on each evaluator
  // An invariant we want to maintain is that for any literal only one
  //  Evaluator will return true for canEvaluate
  _evals.push(new IntEvaluator());
  _evals.push(new RatEvaluator());
  _evals.push(new RealEvaluator());
  _evals.push(new ConversionEvaluator());
  _evals.push(new EqualityEvaluator());

  if(env.options->useACeval() && !env.options->alasca()){
    // Special AC evaluators are added to be tried first for Plus and Multiply
    _evals.push(new ACFunEvaluator<AbelianGroup<Theory::INT_PLUS>>());
    _evals.push(new ACFunEvaluator<AbelianGroup<Theory::INT_MULTIPLY>>());
    _evals.push(new ACFunEvaluator<AbelianGroup<Theory::RAT_PLUS>>());
    _evals.push(new ACFunEvaluator<AbelianGroup<Theory::RAT_MULTIPLY>> ());
    _evals.push(new ACFunEvaluator<AbelianGroup<Theory::REAL_PLUS>> ());
    _evals.push(new ACFunEvaluator<AbelianGroup<Theory::REAL_MULTIPLY>> ());
  }

  _funEvaluators.ensure(0);
  _predEvaluators.ensure(0);

}